

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::LoadBean::
act<hiberlite::AVisitor<hiberlite::LoadBean>,std::__cxx11::string,hiberlite::stl_stream_adapter<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (LoadBean *this,AVisitor<hiberlite::LoadBean> *av,
          collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *nvp)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_value;
  bool bVar1;
  _Elt_pointer ppVar2;
  database_error *this_00;
  ulong uVar3;
  longlong *val;
  long local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry;
  shared_connection local_298;
  vector<long_long,_std::allocator<long_long>_> children;
  shared_res<hiberlite::autoclosed_con> local_260;
  string tab;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string query;
  string local_1d0;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> el;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  string local_c8;
  SQLiteSelect sel;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_78
  ;
  
  std::__cxx11::string::string((string *)&local_108,(string *)nvp);
  AVisitor<hiberlite::LoadBean>::diveTable(av,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  Scope::Scope((Scope *)&el,&av->scope);
  std::__cxx11::string::string((string *)&tab,(string *)&el);
  Scope::~Scope((Scope *)&el);
  local_298._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_298.res = (av->rootKey).con.res;
  if (local_298.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_298.res)->refCount = (local_298.res)->refCount + 1;
  }
  std::__cxx11::string::string((string *)&local_1d0,(string *)&tab);
  ppVar2 = (this->stmt).c.
           super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar2 == (this->stmt).c.
                super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppVar2 = (this->stmt).c.
             super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
  }
  Database::dbSelectChildIds(&children,&local_298,&local_1d0,ppVar2[-1].second);
  std::__cxx11::string::~string((string *)&local_1d0);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_298);
  stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::startLoadFromDb(&nvp->stream);
  local_2a8 = 0;
  uVar3 = 0;
  while( true ) {
    if ((ulong)((long)children.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)children.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar3) {
      AVisitor<hiberlite::LoadBean>::popScope(av);
      std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                (&children.super__Vector_base<long_long,_std::allocator<long_long>_>);
      std::__cxx11::string::~string((string *)&tab);
      return;
    }
    access::construct<hiberlite::AVisitor<hiberlite::LoadBean>,std::__cxx11::string>(av,&entry);
    std::operator+(&local_128,"SELECT * FROM ",&tab);
    std::operator+(&local_230,&local_128," WHERE ");
    std::operator+(&local_210,&local_230,"hiberlite_id");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sel,
                   &local_210,"=");
    Transformer::toSQLiteValue_abi_cxx11_
              (&local_148,
               (Transformer *)
               ((long)children.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start + local_2a8),val);
    std::operator+(&el.name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &sel,&local_148);
    std::operator+(&query,&el.name,";");
    std::__cxx11::string::~string((string *)&el);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&sel);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_128);
    local_260._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
    local_260.res = (av->rootKey).con.res;
    if (local_260.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_260.res)->refCount = (local_260.res)->refCount + 1;
    }
    std::__cxx11::string::string((string *)&local_c8,(string *)&query);
    SQLiteSelect::SQLiteSelect(&sel,&local_260,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_260);
    bVar1 = SQLiteSelect::step(&sel);
    if (!bVar1) break;
    std::pair<hiberlite::SQLiteSelect,_long_long>::
    pair<hiberlite::SQLiteSelect_&,_long_long_&,_true>
              ((pair<hiberlite::SQLiteSelect,_long_long> *)&el,&sel,
               (longlong *)
               ((long)children.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start + local_2a8));
    std::
    deque<std::pair<hiberlite::SQLiteSelect,long_long>,std::allocator<std::pair<hiberlite::SQLiteSelect,long_long>>>
    ::emplace_back<std::pair<hiberlite::SQLiteSelect,long_long>>
              ((deque<std::pair<hiberlite::SQLiteSelect,long_long>,std::allocator<std::pair<hiberlite::SQLiteSelect,long_long>>>
                *)this,(pair<hiberlite::SQLiteSelect,_long_long> *)&el);
    SQLiteSelect::~SQLiteSelect((SQLiteSelect *)&el);
    std::__cxx11::string::string((string *)&local_168,"item",(allocator *)&local_210);
    _value = entry;
    std::__cxx11::string::string((string *)&local_e8,"",(allocator *)&local_230);
    sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    sql_nvp(&el,&local_168,_value,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_168);
    sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    sql_nvp(&local_78,&el);
    AVisitor<hiberlite::LoadBean>::operator&(av,&local_78);
    sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~sql_nvp(&local_78);
    std::
    deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
    ::pop_back((deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
                *)this);
    stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::putNext(&nvp->stream,entry);
    access::destroy<hiberlite::LoadBean,std::__cxx11::string>(this,entry);
    sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~sql_nvp(&el);
    SQLiteSelect::~SQLiteSelect(&sel);
    std::__cxx11::string::~string((string *)&query);
    uVar3 = uVar3 + 1;
    local_2a8 = local_2a8 + 8;
  }
  this_00 = (database_error *)__cxa_allocate_exception(0x10);
  database_error::database_error(this_00,"id not found in the database");
  __cxa_throw(this_00,&database_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LoadBean::act(AV& av, collection_nvp<E,S> nvp )
{
	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		std::vector<sqlid_t> children=Database::dbSelectChildIds(av.getConnection(), tab, stmt.top().second);
		nvp.stream.startLoadFromDb();

		for(size_t i=0;i<children.size();i++){
			E* entry;
			construct(av,&entry,static_cast<unsigned int>(0));

				std::string query="SELECT * FROM "+tab
								+" WHERE "+HIBERLITE_PRIMARY_KEY_COLUMN+"="+Transformer::toSQLiteValue(children[i])+";";
				SQLiteSelect sel(av.getConnection(), query);
				if(!sel.step())
					throw database_error("id not found in the database");
				stmt.push( std::make_pair(sel,children[i]) );

					sql_nvp<E> el("item", *entry);
					av & el;

				stmt.pop();
			nvp.stream.putNext(*entry);
			destroy(*this, entry, static_cast<unsigned int>(0));
		}
	av.pop();
}